

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonIO.cc
# Opt level: O0

void __thiscall avro::json::JsonGenerator::encodeNumber(JsonGenerator *this,double t)

{
  bool bVar1;
  JsonGenerator *in_RDI;
  JsonGenerator *in_XMM0_Qa;
  double dVar2;
  string *s;
  ostringstream oss;
  JsonGenerator *in_stack_fffffffffffffe20;
  undefined7 in_stack_fffffffffffffe28;
  undefined1 in_stack_fffffffffffffe2f;
  string local_1c0 [32];
  string *local_1a0;
  ostream local_188;
  JsonGenerator *local_10;
  
  local_10 = in_XMM0_Qa;
  sep(in_stack_fffffffffffffe20);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_188);
  bVar1 = boost::math::isfinite<double>((double)in_stack_fffffffffffffe20);
  if (bVar1) {
    std::ostream::operator<<(&local_188,(double)local_10);
  }
  else {
    in_stack_fffffffffffffe2f = boost::math::isnan<double>((double)in_stack_fffffffffffffe20);
    if ((bool)in_stack_fffffffffffffe2f) {
      std::operator<<(&local_188,"NaN");
    }
    else {
      dVar2 = std::numeric_limits<double>::infinity();
      if (((double)local_10 != dVar2) || (NAN((double)local_10) || NAN(dVar2))) {
        std::operator<<(&local_188,"-Infinity");
        in_stack_fffffffffffffe20 = local_10;
      }
      else {
        std::operator<<(&local_188,"Infinity");
        in_stack_fffffffffffffe20 = local_10;
      }
    }
  }
  std::__cxx11::ostringstream::str();
  local_1a0 = local_1c0;
  std::__cxx11::string::operator[]((ulong)local_1a0);
  std::__cxx11::string::size();
  StreamWriter::writeBytes
            (&in_RDI->out_,(uint8_t *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28),
             (size_t)in_stack_fffffffffffffe20);
  sep2(in_RDI);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_188);
  return;
}

Assistant:

void JsonGenerator::encodeNumber(double t) {
    sep();
    std::ostringstream oss;
    if (boost::math::isfinite(t)) {
        oss << t;
    } else if (boost::math::isnan(t)) {
        oss << "NaN";
    } else if (t == std::numeric_limits<double>::infinity()) {
        oss << "Infinity";
    } else {
        oss << "-Infinity";
    }
    const std::string& s = oss.str();
    out_.writeBytes(reinterpret_cast<const uint8_t*>(&s[0]), s.size());
    sep2();
}